

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  cmTarget *this;
  allocator<char> local_59;
  string local_58;
  cmListFileBacktrace local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,tgt,(allocator<char> *)&local_38);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (this == (cmTarget *)0x0) {
    cmSystemTools::Error
              ("Attempt to add link directories to non-existent target: ",tgt," for directory ",d);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,d,&local_59);
    cmMakefile::GetBacktrace((cmMakefile *)arg);
    cmTarget::InsertLinkDirectory(this,&local_58,&local_38,false);
    if (local_38.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                       const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: ", tgt,
      " for directory ", d);
    return;
  }
  t->InsertLinkDirectory(d, mf->GetBacktrace());
}